

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O1

void __thiscall
ParserProbModelXML::AddToLocalSFActionScope(ParserProbModelXML *this,Index sfI,Scope *AScope)

{
  pointer pSVar1;
  ulong uVar2;
  ulong uVar3;
  Scope local_48;
  
  uVar3 = (ulong)sfI;
  pSVar1 = (this->_m_AScopes_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->_m_AScopes_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) * -0x5555555555555555;
  if (uVar2 < uVar3 || uVar2 - uVar3 == 0) {
    do {
      local_48.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Scope,_std::allocator<Scope>_>::emplace_back<Scope>(&this->_m_AScopes_Y,&local_48)
      ;
      if (local_48.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pSVar1 = (this->_m_AScopes_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = ((long)(this->_m_AScopes_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) * -0x5555555555555555;
    } while (uVar2 < uVar3 || uVar2 - uVar3 == 0);
  }
  Scope::Insert(pSVar1 + uVar3,AScope);
  return;
}

Assistant:

void ParserProbModelXML::AddToLocalSFActionScope(Index sfI, Scope AScope)
{
    while(_m_AScopes_Y.size() <= sfI)
        _m_AScopes_Y.push_back(Scope());
    
    _m_AScopes_Y[sfI].Insert(AScope);
}